

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValue
          (AsciiParser *this,string *type_name,Value *result)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream ss_e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  optional<unsigned_int> local_198 [14];
  ios_base local_128 [264];
  
  tinyusdz::value::TryGetTypeId(local_198,type_name);
  if (local_198[0].has_value_ == false) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
               ,0x62);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"ParseTimeSampleValue",0x14);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"():",3);
    poVar2 = (ostream *)::std::ostream::operator<<(local_198,0xa4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    ::std::operator+(&local_1b8,"Unsupported/invalid timeSamples type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)type_name)
    ;
    poVar2 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    ::std::ios_base::~ios_base(local_128);
    bVar1 = false;
  }
  else {
    bVar1 = ParseTimeSampleValue(this,(uint32_t)local_198[0].contained,result);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ParseTimeSampleValue(const std::string &type_name, value::Value *result) {

  nonstd::optional<uint32_t> type_id = value::TryGetTypeId(type_name);

  if (!type_id) {
    PUSH_ERROR_AND_RETURN("Unsupported/invalid timeSamples type " + type_name);
  }

  return ParseTimeSampleValue(type_id.value(), result);
}